

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::CreateImage::verify
          (CreateImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  TextureFormat local_40;
  TextureLevel local_38;
  
  local_40.order = RGBA;
  local_40.type = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(&local_38,&local_40,this->m_imageWidth,this->m_imageHeight,1);
  *(int *)(ctx + 0x58) = local_38.m_size.m_data[2];
  *(TextureFormat *)(ctx + 0x48) = local_38.m_format;
  *(undefined8 *)(ctx + 0x50) = local_38.m_size.m_data._0_8_;
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
            ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)(ctx + 0x60),&local_38.m_data);
  tcu::TextureLevel::~TextureLevel(&local_38);
  return extraout_EAX;
}

Assistant:

void CreateImage::verify (VerifyContext& context, size_t)
{
	context.getReferenceImage() = TextureLevel(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_imageWidth, m_imageHeight);
}